

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool findKeyPresses<short>
               (TWaveformViewT<short> *waveform,TKeyPressCollectionT<short> *res,
               TWaveformT<short> *waveformThreshold,TWaveformT<short> *waveformMax,
               double thresholdBackground,int historySize,int historySizeReset,bool removeLowPower)

{
  pointer *ppsVar1;
  short sVar2;
  short *psVar3;
  size_type __n;
  iterator iVar4;
  long lVar5;
  pointer psVar6;
  short sVar7;
  TKeyPressPosition TVar8;
  TValueCC TVar9;
  int64_t iVar10;
  TKey TVar11;
  TKey TVar12;
  undefined4 uVar13;
  long lVar14;
  long *plVar15;
  pointer psVar16;
  size_type sVar17;
  long *plVar18;
  long *plVar19;
  pointer psVar20;
  stKeyPressData<short> *psVar21;
  TKeyPressCollectionT<short> *__range3;
  iterator __end0;
  int iVar22;
  stKeyPressData<short> *kp_1;
  size_type __n_00;
  pointer __args;
  long lVar23;
  pointer psVar24;
  long lVar25;
  int iVar26;
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  TWaveformT<short> waveformAbs;
  vector<double,_std::allocator<double>_> rbSamples;
  long local_128;
  double local_120;
  stKeyPressData<short> local_118;
  vector<short,_std::allocator<short>_> local_e8;
  vector<short,_std::allocator<short>_> *local_d0;
  int local_c4;
  _Deque_base<long,_std::allocator<long>_> local_c0;
  TWaveformT<short> *local_70;
  double local_68;
  vector<double,_std::allocator<double>_> local_60;
  TWaveformViewT<short> *local_48;
  long local_40;
  long local_38;
  undefined1 auVar27 [16];
  
  psVar24 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
            super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
      super__Vector_impl_data._M_finish != psVar24) {
    (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
    super__Vector_impl_data._M_finish = psVar24;
  }
  local_d0 = waveformMax;
  local_c4 = historySizeReset;
  local_70 = waveformThreshold;
  local_68 = thresholdBackground;
  std::vector<short,_std::allocator<short>_>::resize(waveformThreshold,waveform->n);
  std::vector<short,_std::allocator<short>_>::resize(local_d0,waveform->n);
  local_c0._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,(long)(historySize * 8),(value_type_conflict5 *)&local_c0,
             (allocator_type *)&local_118);
  __n_00 = (size_type)historySize;
  std::deque<long,_std::allocator<long>_>::deque
            ((deque<long,_std::allocator<long>_> *)&local_c0,__n_00,(allocator_type *)&local_118);
  psVar3 = waveform->samples;
  __n = waveform->n;
  std::vector<short,_std::allocator<short>_>::vector(&local_e8,__n,(allocator_type *)&local_118);
  if (0 < (long)__n) {
    sVar17 = 0;
    do {
      sVar2 = psVar3[sVar17];
      sVar7 = -sVar2;
      if (0 < sVar2) {
        sVar7 = sVar2;
      }
      local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar17] = sVar7;
      sVar17 = sVar17 + 1;
    } while (__n != sVar17);
    local_128 = 0;
    local_48 = waveform;
    if (0 < (long)__n) {
      local_38 = (long)(historySize * 2);
      local_40 = __n - local_38;
      local_120 = 0.0;
      iVar22 = 0;
LAB_0012b7a8:
      if (historySize / 2 <= local_128) {
        lVar14 = (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        auVar27._8_4_ =
             (int)((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x23);
        auVar27._0_8_ = lVar14;
        auVar27._12_4_ = 0x45300000;
        iVar26 = (int)lVar14;
        dVar29 = (auVar27._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,iVar26) - 4503599627370496.0);
        dVar30 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar22];
        sVar2 = local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start[local_128];
        local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[iVar22] = (double)(int)sVar2;
        local_120 = ((local_120 * dVar29 - dVar30) + (double)(int)sVar2) / dVar29;
        iVar22 = iVar22 + 1;
        if (iVar26 <= iVar22) {
          iVar22 = 0;
        }
      }
      plVar15 = local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if ((long)__n_00 <= local_128) {
        while (plVar15 != local_c0._M_impl.super__Deque_impl_data._M_start._M_cur) {
          if ((long)(local_128 - __n_00) < *local_c0._M_impl.super__Deque_impl_data._M_start._M_cur)
          {
            plVar19 = local_c0._M_impl.super__Deque_impl_data._M_start._M_cur;
            plVar18 = local_c0._M_impl.super__Deque_impl_data._M_finish._M_first;
            if (plVar15 != local_c0._M_impl.super__Deque_impl_data._M_start._M_cur)
            goto LAB_0012b9b0;
            break;
          }
          if (local_c0._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_c0._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_c0._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_c0._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_c0._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_c0._M_impl.super__Deque_impl_data._M_start._M_last =
                 local_c0._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
            plVar15 = local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur;
            local_c0._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_c0._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_c0._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_c0._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_c0._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_c0._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
        }
        goto LAB_0012ba42;
      }
      plVar18 = local_c0._M_impl.super__Deque_impl_data._M_start._M_cur;
      plVar15 = local_c0._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_c0._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          if (local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur == plVar15) {
            if (local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start[local_128] <
                local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start
                [local_c0._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]]) break;
            operator_delete(plVar15,0x200);
            plVar15 = local_c0._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_c0._M_impl.super__Deque_impl_data._M_finish._M_last = plVar15 + 0x40;
            local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur = plVar15 + 0x3f;
            plVar18 = local_c0._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_c0._M_impl.super__Deque_impl_data._M_finish._M_first = plVar15;
            local_c0._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_c0._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start[local_128] <
                local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                super__Vector_impl_data._M_start
                [local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur[-1]]) break;
            local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          }
        } while (local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur != plVar18);
      }
      if (local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_c0._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                  ((deque<long,std::allocator<long>> *)&local_c0,&local_128);
      }
      else {
        *local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur = local_128;
        local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      goto LAB_0012bb81;
    }
  }
LAB_0012bb95:
  if (removeLowPower) {
    do {
      psVar24 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      psVar16 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (psVar16 == psVar24) {
        psVar20 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ).
                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0012bccb:
        lVar14 = 0;
      }
      else {
        lVar14 = ((long)psVar16 - (long)psVar24 >> 4) * -0x5555555555555555;
        dVar30 = 0.0;
        psVar20 = psVar24;
        do {
          dVar30 = dVar30 + (double)(int)local_e8.super__Vector_base<short,_std::allocator<short>_>.
                                         _M_impl.super__Vector_impl_data._M_start[psVar20->pos];
          psVar20 = psVar20 + 1;
        } while (psVar20 != psVar16);
        psVar20 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ).
                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (psVar24 == psVar16) goto LAB_0012bccb;
        auVar28._8_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar28._0_8_ = lVar14;
        auVar28._12_4_ = 0x45300000;
        local_120 = (dVar30 / ((auVar28._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0))) *
                    0.3;
        __args = psVar24;
        do {
          if (local_120 <
              (double)(int)local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                           super__Vector_impl_data._M_start[__args->pos]) {
            iVar4._M_current =
                 (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
                 .super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>>::
              _M_realloc_insert<stKeyPressData<short>const&>
                        ((vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>> *)res,
                         iVar4,__args);
            }
            else {
              psVar3 = (__args->waveform).samples;
              iVar10 = (__args->waveform).n;
              TVar8 = __args->pos;
              TVar9 = __args->ccAvg;
              TVar11 = __args->bind;
              TVar12 = __args->predicted;
              uVar13 = *(undefined4 *)&__args->field_0x2c;
              (iVar4._M_current)->cid = __args->cid;
              (iVar4._M_current)->bind = TVar11;
              (iVar4._M_current)->predicted = TVar12;
              *(undefined4 *)&(iVar4._M_current)->field_0x2c = uVar13;
              (iVar4._M_current)->pos = TVar8;
              (iVar4._M_current)->ccAvg = TVar9;
              ((iVar4._M_current)->waveform).samples = psVar3;
              ((iVar4._M_current)->waveform).n = iVar10;
              ppsVar1 = &(res->
                         super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ).
                         super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppsVar1 = *ppsVar1 + 1;
            }
          }
          __args = __args + 1;
        } while (__args != psVar16);
        lVar14 = (long)(res->
                       super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
                       .
                       super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(res->
                       super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
                       .
                       super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      }
      if (psVar24 != (pointer)0x0) {
        operator_delete(psVar24,(long)psVar20 - (long)psVar24);
      }
    } while (lVar14 != (long)psVar16 - (long)psVar24);
  }
  psVar21 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
            super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(res->
                         super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ).
                         super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)psVar21 >> 4) *
                 -0x5555555555555555)) {
    local_118.pos._0_4_ = 0;
    local_118.pos._4_4_ = 0;
    local_118.ccAvg._0_4_ = 0;
    local_118.waveform.samples = (short *)0x0;
    local_118.waveform.n._0_4_ = 0;
    local_118.waveform.n._4_4_ = 0;
    std::vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>>::
    _M_realloc_insert<stKeyPressData<short>const&>
              ((vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>> *)&local_118,
               (iterator)0x0,psVar21);
    psVar24 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    psVar16 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (1 < (int)((ulong)((long)psVar16 - (long)psVar24) >> 4) * -0x55555555) {
      lVar25 = (long)local_c4;
      lVar14 = 1;
      lVar23 = 0x30;
      do {
        lVar5 = *(long *)((long)&psVar24->pos + lVar23);
        if ((lVar25 < lVar5 - ((stKeyPressData<short> *)(local_118.waveform.n + -0x30))->pos) ||
           (psVar6 = (local_d0->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                     super__Vector_impl_data._M_start,
           psVar6[((stKeyPressData<short> *)(local_118.waveform.n + -0x30))->pos] < psVar6[lVar5]))
        {
          psVar21 = (stKeyPressData<short> *)((long)&(psVar24->waveform).samples + lVar23);
          if ((stKeyPressData<short> *)local_118.waveform.n ==
              (stKeyPressData<short> *)CONCAT44(local_118.pos._4_4_,(undefined4)local_118.pos)) {
            std::vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>>::
            _M_realloc_insert<stKeyPressData<short>const&>
                      ((vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>> *)
                       &local_118,(iterator)local_118.waveform.n,psVar21);
          }
          else {
            psVar3 = (psVar21->waveform).samples;
            iVar10 = (psVar21->waveform).n;
            TVar8 = psVar21->pos;
            TVar9 = psVar21->ccAvg;
            TVar11 = psVar21->bind;
            TVar12 = psVar21->predicted;
            uVar13 = *(undefined4 *)&psVar21->field_0x2c;
            ((stKeyPressData<short> *)local_118.waveform.n)->cid = psVar21->cid;
            ((stKeyPressData<short> *)local_118.waveform.n)->bind = TVar11;
            ((stKeyPressData<short> *)local_118.waveform.n)->predicted = TVar12;
            *(undefined4 *)&((stKeyPressData<short> *)local_118.waveform.n)->field_0x2c = uVar13;
            ((stKeyPressData<short> *)local_118.waveform.n)->pos = TVar8;
            ((stKeyPressData<short> *)local_118.waveform.n)->ccAvg = TVar9;
            (((stKeyPressData<short> *)local_118.waveform.n)->waveform).samples = psVar3;
            (((stKeyPressData<short> *)local_118.waveform.n)->waveform).n = iVar10;
            local_118.waveform.n = local_118.waveform.n + 0x30;
          }
        }
        lVar14 = lVar14 + 1;
        psVar24 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ).
                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar16 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ).
                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar23 = lVar23 + 0x30;
      } while (lVar14 < (int)((ulong)((long)psVar16 - (long)psVar24) >> 4) * -0x55555555);
    }
    psVar20 = (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
              super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar22 = res->nClusters;
    (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_118.waveform.samples;
    (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_118.waveform.n;
    (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
    super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_118.pos._4_4_,(undefined4)local_118.pos);
    res->nClusters = local_118.ccAvg._0_4_;
    local_118.waveform.n._0_4_ = SUB84(psVar16,0);
    local_118.waveform.n._4_4_ = (undefined4)((ulong)psVar16 >> 0x20);
    local_118.waveform.samples = (short *)psVar24;
    local_118.ccAvg._0_4_ = iVar22;
    local_118.pos = (TKeyPressPosition)psVar20;
    if (psVar24 != (pointer)0x0) {
      operator_delete(psVar24,(long)psVar20 - (long)psVar24);
    }
  }
  if (local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_c0);
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return true;
LAB_0012b9b0:
  do {
    if (plVar15 == plVar18) {
      if (local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
          ._M_start[local_128] <
          local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
          ._M_start[local_c0._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]]) break;
      operator_delete(plVar18,0x200);
      plVar18 = local_c0._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
      local_c0._M_impl.super__Deque_impl_data._M_finish._M_last = plVar18 + 0x40;
      plVar15 = plVar18 + 0x3f;
      plVar19 = local_c0._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_c0._M_impl.super__Deque_impl_data._M_finish._M_first = plVar18;
      local_c0._M_impl.super__Deque_impl_data._M_finish._M_node =
           local_c0._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
    }
    else {
      if (local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
          ._M_start[local_128] <
          local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data
          ._M_start[plVar15[-1]]) break;
      plVar15 = plVar15 + -1;
    }
    local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur = plVar15;
  } while (plVar15 != plVar19);
LAB_0012ba42:
  if (plVar15 == local_c0._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
              ((deque<long,std::allocator<long>> *)&local_c0,&local_128);
  }
  else {
    *plVar15 = local_128;
    local_c0._M_impl.super__Deque_impl_data._M_finish._M_cur = plVar15 + 1;
  }
  psVar24 = (pointer)(local_128 - historySize / 2);
  if ((((long)psVar24 < local_40 && local_38 <= (long)psVar24) &&
      ((pointer)*local_c0._M_impl.super__Deque_impl_data._M_start._M_cur == psVar24)) &&
     (local_120 * local_68 <
      (double)(int)local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)psVar24])) {
    local_118.waveform.samples = local_48->samples;
    iVar10 = local_48->n;
    local_118.waveform.n._0_4_ = (undefined4)iVar10;
    local_118.waveform.n._4_4_ = (undefined4)((ulong)iVar10 >> 0x20);
    local_118.ccAvg._0_4_ = 0;
    local_118.ccAvg._4_4_ = 0;
    local_118.cid = -1;
    local_118.bind = -1;
    local_118.predicted = 0x3f;
    iVar4._M_current =
         (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
         super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_118.pos = (TKeyPressPosition)psVar24;
    if (iVar4._M_current ==
        (res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>>::
      _M_realloc_insert<stKeyPressData<short>>
                ((vector<stKeyPressData<short>,std::allocator<stKeyPressData<short>>> *)res,iVar4,
                 &local_118);
    }
    else {
      (iVar4._M_current)->cid = -1;
      (iVar4._M_current)->bind = -1;
      *(ulong *)&(iVar4._M_current)->predicted = CONCAT44(local_118._44_4_,0x3f);
      (iVar4._M_current)->pos = (TKeyPressPosition)psVar24;
      (iVar4._M_current)->ccAvg = 0.0;
      ((iVar4._M_current)->waveform).samples = local_118.waveform.samples;
      ((iVar4._M_current)->waveform).n = iVar10;
      ppsVar1 = &(res->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
                 .super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppsVar1 = *ppsVar1 + 1;
    }
  }
  (local_70->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
  _M_start[(long)psVar24] = (short)(int)(local_120 * local_68);
  (local_d0->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
  _M_start[(long)psVar24] =
       local_e8.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
       _M_start[*local_c0._M_impl.super__Deque_impl_data._M_start._M_cur];
LAB_0012bb81:
  local_128 = local_128 + 1;
  if ((long)__n <= local_128) goto LAB_0012bb95;
  goto LAB_0012b7a8;
}

Assistant:

bool findKeyPresses(
        const TWaveformViewT<T> & waveform,
        TKeyPressCollectionT<T> & res,
        TWaveformT<T> & waveformThreshold,
        TWaveformT<T> & waveformMax,
        double thresholdBackground,
        int historySize,
        int historySizeReset,
        bool removeLowPower) {
    res.clear();
    waveformThreshold.resize(waveform.n);
    waveformMax.resize(waveform.n);

    int rbBegin = 0;
    double rbAverage = 0.0;
    std::vector<double> rbSamples(8*historySize, 0.0);

    int k = historySize;
    std::deque<int64_t> que(k);

    auto samples = waveform.samples;
    auto n       = waveform.n;

    TWaveformT<T> waveformAbs(n);
    for (int64_t i = 0; i < n; ++i) {
        waveformAbs[i] = std::abs(samples[i]);
    }

    for (int64_t i = 0; i < n; ++i) {
        {
            int64_t ii = i - k/2;
            if (ii >= 0) {
                rbAverage *= rbSamples.size();
                rbAverage -= rbSamples[rbBegin];
                double acur = waveformAbs[i];
                rbSamples[rbBegin] = acur;
                rbAverage += acur;
                rbAverage /= rbSamples.size();
                if (++rbBegin >= (int) rbSamples.size()) {
                    rbBegin = 0;
                }
            }
        }

        if (i < k) {
            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }
            que.push_back(i);
        } else {
            while((!que.empty()) && que.front() <= i - k) {
                que.pop_front();
            }

            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }

            que.push_back(i);

            int64_t itest = i - k/2;
            if (itest >= 2*k && itest < n - 2*k && que.front() == itest) {
                double acur = waveformAbs[itest];
                if (acur > thresholdBackground*rbAverage) {
                    res.emplace_back(TKeyPressDataT<T> { std::move(waveform), itest, 0.0, -1, -1, '?' });
                }
            }
            waveformThreshold[itest] = thresholdBackground*rbAverage;
            waveformMax[itest] = waveformAbs[que.front()];
        }
    }

    if (removeLowPower) {
        while (true) {
            auto oldn = res.size();

            double avgPower = 0.0;
            for (const auto & kp : res) {
                avgPower += waveformAbs[kp.pos];
            }
            avgPower /= res.size();

            auto tmp = std::move(res);
            for (const auto & kp : tmp) {
                if (waveformAbs[kp.pos] > 0.3*avgPower) {
                    res.push_back(kp);
                }
            }

            if (res.size() == oldn) break;
        }
    }

    if (res.size() > 1) {
        TKeyPressCollectionT<T> res2;
        res2.push_back(res.front());

        for (int i = 1; i < (int) res.size(); ++i) {
            if (res[i].pos - res2.back().pos > historySizeReset || waveformMax[res[i].pos] > waveformMax[res2.back().pos]) {
                res2.push_back(res[i]);
            }
        }

        std::swap(res, res2);
    }

    return true;
}